

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool __thiscall libcellml::Units::removeUnit(Units *this,size_t index)

{
  UnitsImpl *pUVar1;
  size_type sVar2;
  UnitsImpl *pUVar3;
  __normal_iterator<libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_38;
  __normal_iterator<libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_30;
  const_iterator local_28;
  byte local_19;
  size_t sStack_18;
  bool status;
  size_t index_local;
  Units *this_local;
  
  local_19 = 0;
  sStack_18 = index;
  index_local = (size_t)this;
  pUVar1 = pFunc(this);
  sVar2 = std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::size
                    (&pUVar1->mUnitDefinitions);
  if (index < sVar2) {
    pUVar1 = pFunc(this);
    pUVar3 = pFunc(this);
    local_38._M_current =
         (UnitDefinition *)
         std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::begin
                   (&pUVar3->mUnitDefinitions);
    local_30 = __gnu_cxx::
               __normal_iterator<libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
               ::operator+(&local_38,sStack_18);
    __gnu_cxx::
    __normal_iterator<libcellml::UnitDefinition_const*,std::vector<libcellml::UnitDefinition,std::allocator<libcellml::UnitDefinition>>>
    ::__normal_iterator<libcellml::UnitDefinition*>
              ((__normal_iterator<libcellml::UnitDefinition_const*,std::vector<libcellml::UnitDefinition,std::allocator<libcellml::UnitDefinition>>>
                *)&local_28,&local_30);
    std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::erase
              (&pUVar1->mUnitDefinitions,local_28);
    local_19 = 1;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool Units::removeUnit(size_t index)
{
    bool status = false;
    if (index < pFunc()->mUnitDefinitions.size()) {
        pFunc()->mUnitDefinitions.erase(pFunc()->mUnitDefinitions.begin() + ptrdiff_t(index));
        status = true;
    }

    return status;
}